

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  size_t *psVar4;
  LRUHandle *pLVar5;
  long lVar6;
  Slice *key;
  Mutex *this_00;
  LRUHandle *e;
  
  lVar6 = 0;
  do {
    this_00 = &this->shard_[lVar6].mutex_;
    port::Mutex::Lock(this_00);
    pLVar5 = &this->shard_[lVar6].lru_;
    e = this->shard_[lVar6].lru_.next;
    if (e != pLVar5) {
      do {
        pLVar1 = e->next;
        if (e->refs == 1) {
          if (pLVar1 == e) {
            key = *e->value;
            psVar4 = (size_t *)((long)e->value + 8);
          }
          else {
            key = (Slice *)e->key_data;
            psVar4 = &e->key_length;
          }
          HandleTable::Remove(&this->shard_[lVar6].table_,key,(uint32_t)*psVar4);
          pLVar2 = e->next;
          pLVar3 = e->prev;
          pLVar2->prev = pLVar3;
          pLVar3->next = pLVar2;
          LRUCache::Unref(this->shard_ + lVar6,e);
        }
        e = pLVar1;
      } while (pLVar1 != pLVar5);
    }
    port::Mutex::Unlock(this_00);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  return;
}

Assistant:

virtual void Prune() {
                for (int s = 0; s < kNumShards; s++) {
                    shard_[s].Prune();
                }
            }